

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

QRectF * __thiscall
QWidgetTextControl::selectionRect
          (QRectF *__return_storage_ptr__,QWidgetTextControl *this,QTextCursor *cursor)

{
  QWidgetTextControlPrivate *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 *puVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  long *plVar10;
  qreal extraout_RDX;
  qreal extraout_RDX_00;
  ConstIterator it;
  undefined8 *puVar11;
  int i;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined8 *puVar14;
  long in_FS_OFFSET;
  double dVar15;
  QRectF r;
  QRectF local_f8;
  QRectF local_d8;
  undefined1 local_b8 [32];
  QArrayData *local_98;
  undefined8 *puStack_90;
  undefined1 *local_88;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetTextControlPrivate **)(this + 8);
  *(undefined4 *)&__return_storage_ptr__->w = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->h = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->xp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->xp + 4) = 0xffffffff;
  *(undefined4 *)&__return_storage_ptr__->yp = 0xffffffff;
  *(undefined4 *)((long)&__return_storage_ptr__->yp + 4) = 0xffffffff;
  iVar5 = QTextCursor::selectionStart();
  QWidgetTextControlPrivate::rectForPosition(__return_storage_ptr__,this_00,iVar5);
  cVar4 = QTextCursor::hasComplexSelection();
  if ((cVar4 != '\0') && (lVar8 = QTextCursor::currentTable(), lVar8 != 0)) {
    uVar9 = QTextCursor::currentTable();
    plVar10 = (long *)QTextDocument::documentLayout();
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (**(code **)(*plVar10 + 0x80))(__return_storage_ptr__,plVar10,uVar9);
      return __return_storage_ptr__;
    }
    goto LAB_004c78c2;
  }
  cVar4 = QTextCursor::hasSelection();
  if (cVar4 != '\0') {
    QTextCursor::selectionStart();
    QTextCursor::selectionEnd();
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_68);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    QTextDocument::findBlock((int)&local_78);
    if (local_68 == local_78) {
      if (((int)puStack_60 != (int)puStack_70) || (cVar4 = QTextBlock::isValid(), cVar4 == '\0'))
      goto LAB_004c75d0;
      QTextBlock::layout();
      iVar5 = QTextLayout::lineCount();
      if (iVar5 == 0) goto LAB_004c75d0;
      iVar5 = QTextBlock::layout();
      QTextBlock::position();
      iVar6 = QTextLayout::lineForTextPosition(iVar5);
      iVar5 = QTextBlock::layout();
      QTextBlock::position();
      iVar7 = QTextLayout::lineForTextPosition(iVar5);
      iVar5 = iVar7;
      if (iVar6 < iVar7) {
        iVar5 = iVar6;
      }
      if (iVar7 < iVar6) {
        iVar7 = iVar6;
      }
      iVar6 = QTextBlock::layout();
      __return_storage_ptr__->xp = 0.0;
      __return_storage_ptr__->yp = 0.0;
      __return_storage_ptr__->w = 0.0;
      __return_storage_ptr__->h = 0.0;
      do {
        local_d8.xp._0_4_ = QTextLayout::lineAt(iVar6);
        local_d8.yp = extraout_RDX;
        QTextLine::rect();
        QRectF::operator|(&local_58,__return_storage_ptr__);
        __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
        __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
        __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
        __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
        local_d8.xp._0_4_ = QTextLayout::lineAt(iVar6);
        local_d8.yp = extraout_RDX_00;
        QTextLine::naturalTextRect();
        QRectF::operator|(&local_58,__return_storage_ptr__);
        *(undefined4 *)&__return_storage_ptr__->w = local_58.w._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->w + 4) = local_58.w._4_4_;
        *(undefined4 *)&__return_storage_ptr__->h = local_58.h._0_4_;
        *(undefined4 *)((long)&__return_storage_ptr__->h + 4) = local_58.h._4_4_;
        __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
        __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
        iVar5 = iVar5 + 1;
      } while (iVar7 + 1 != iVar5);
      (**(code **)(*(long *)this + 0x80))(&local_58,this,&local_68);
      __return_storage_ptr__->xp =
           __return_storage_ptr__->xp + (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp =
           __return_storage_ptr__->yp + (double)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
    }
    else {
LAB_004c75d0:
      local_d8.w._0_4_ = 0xffffffff;
      local_d8.w._4_4_ = 0xffffffff;
      local_d8.h._0_4_ = 0xffffffff;
      local_d8.h._4_4_ = 0xffffffff;
      local_d8.xp._0_4_ = 0xffffffff;
      local_d8.xp._4_4_ = 0xffffffff;
      local_d8.yp = -NAN;
      iVar5 = QTextCursor::selectionEnd();
      QWidgetTextControlPrivate::rectForPosition(&local_d8,this_00,iVar5);
      QRectF::operator|(&local_58,__return_storage_ptr__);
      __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
      __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
      __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      local_f8.xp = 0.0;
      local_f8.yp = 0.0;
      local_f8.w = 0.0;
      local_f8.h = 0.0;
      QTextCursor::currentFrame();
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::childFrames();
      puVar12 = local_88;
      puVar11 = puStack_90;
      iVar5 = QTextCursor::selectionStart();
      puVar14 = puStack_90;
      puVar13 = local_88;
      while (puVar3 = puVar12, puStack_90 = puVar14, local_88 = puVar13, 0 < (long)puVar3) {
        puVar12 = (undefined1 *)((ulong)puVar3 >> 1);
        iVar7 = QTextFrame::firstPosition();
        puVar14 = puStack_90;
        puVar13 = local_88;
        if (iVar7 < iVar5) {
          puVar11 = puVar11 + (long)(puVar12 + 1);
          puVar12 = puVar3 + ~(ulong)puVar12;
        }
      }
      iVar5 = QTextCursor::selectionEnd();
      while (puVar12 = puVar13, 0 < (long)puVar12) {
        puVar13 = (undefined1 *)((ulong)puVar12 >> 1);
        iVar7 = QTextFrame::firstPosition();
        if (iVar7 <= iVar5) {
          puVar14 = puVar14 + (long)(puVar13 + 1);
          puVar13 = puVar12 + ~(ulong)puVar13;
        }
      }
      if (puVar11 != puVar14) {
        do {
          QTextFrame::frameFormat((QTextFrame *)&local_58);
          iVar5 = QTextFormat::intProperty((int)&local_58);
          QTextFormat::~QTextFormat((QTextFormat *)&local_58);
          if (iVar5 != 0) {
            QTextObject::document();
            plVar10 = (long *)QTextDocument::documentLayout();
            (**(code **)(*plVar10 + 0x80))(local_b8,plVar10,*puVar11);
            QRectF::operator|(&local_58,&local_f8);
            local_f8.xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
            local_f8.yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
            local_f8.w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
            local_f8.h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
          }
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar14);
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,8,0x10);
        }
      }
      QRectF::operator|(&local_58,__return_storage_ptr__);
      __return_storage_ptr__->w = (qreal)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
      __return_storage_ptr__->h = (qreal)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
      __return_storage_ptr__->xp = (qreal)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_);
      __return_storage_ptr__->yp = (qreal)CONCAT44(local_58.yp._4_4_,local_58.yp._0_4_);
      local_58.w._0_4_ = 0xffffffff;
      local_58.w._4_4_ = 0xffffffff;
      local_58.h._0_4_ = 0xffffffff;
      local_58.h._4_4_ = 0xffffffff;
      local_58.xp._0_4_ = 0xffffffff;
      local_58.xp._4_4_ = 0xffffffff;
      local_58.yp._0_4_ = 0xffffffff;
      local_58.yp._4_4_ = 0xffffffff;
      plVar10 = (long *)QTextDocument::documentLayout();
      uVar9 = QTextCursor::currentFrame();
      (**(code **)(*plVar10 + 0x80))(&local_58,plVar10,uVar9);
      dVar15 = (double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) - __return_storage_ptr__->xp;
      dVar2 = __return_storage_ptr__->xp + dVar15;
      __return_storage_ptr__->xp = dVar2;
      __return_storage_ptr__->w = __return_storage_ptr__->w - dVar15;
      __return_storage_ptr__->w =
           ((double)CONCAT44(local_58.xp._4_4_,local_58.xp._0_4_) +
           (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_)) - dVar2;
    }
    if ((0.0 < __return_storage_ptr__->w) && (0.0 < __return_storage_ptr__->h)) {
      dVar2 = __return_storage_ptr__->xp + -1.0;
      dVar15 = __return_storage_ptr__->yp + -1.0;
      auVar1._8_4_ = SUB84(dVar15,0);
      auVar1._0_8_ = dVar2;
      auVar1._12_4_ = (int)((ulong)dVar15 >> 0x20);
      __return_storage_ptr__->xp = dVar2;
      __return_storage_ptr__->yp = (qreal)auVar1._8_8_;
      __return_storage_ptr__->w = __return_storage_ptr__->w + 2.0;
      __return_storage_ptr__->h = __return_storage_ptr__->h + 2.0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004c78c2:
  __stack_chk_fail();
}

Assistant:

QRectF QWidgetTextControl::selectionRect(const QTextCursor &cursor) const
{
    Q_D(const QWidgetTextControl);

    QRectF r = d->rectForPosition(cursor.selectionStart());

    if (cursor.hasComplexSelection() && cursor.currentTable()) {
        QTextTable *table = cursor.currentTable();

        r = d->doc->documentLayout()->frameBoundingRect(table);
        /*
        int firstRow, numRows, firstColumn, numColumns;
        cursor.selectedTableCells(&firstRow, &numRows, &firstColumn, &numColumns);

        const QTextTableCell firstCell = table->cellAt(firstRow, firstColumn);
        const QTextTableCell lastCell = table->cellAt(firstRow + numRows - 1, firstColumn + numColumns - 1);

        const QAbstractTextDocumentLayout * const layout = doc->documentLayout();

        QRectF tableSelRect = layout->blockBoundingRect(firstCell.firstCursorPosition().block());

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow, col);
            const qreal y = layout->blockBoundingRect(cell.firstCursorPosition().block()).top();

            tableSelRect.setTop(qMin(tableSelRect.top(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn);
            const qreal x = layout->blockBoundingRect(cell.firstCursorPosition().block()).left();

            tableSelRect.setLeft(qMin(tableSelRect.left(), x));
        }

        for (int col = firstColumn; col < firstColumn + numColumns; ++col) {
            const QTextTableCell cell = table->cellAt(firstRow + numRows - 1, col);
            const qreal y = layout->blockBoundingRect(cell.lastCursorPosition().block()).bottom();

            tableSelRect.setBottom(qMax(tableSelRect.bottom(), y));
        }

        for (int row = firstRow; row < firstRow + numRows; ++row) {
            const QTextTableCell cell = table->cellAt(row, firstColumn + numColumns - 1);
            const qreal x = layout->blockBoundingRect(cell.lastCursorPosition().block()).right();

            tableSelRect.setRight(qMax(tableSelRect.right(), x));
        }

        r = tableSelRect.toRect();
        */
    } else if (cursor.hasSelection()) {
        const int position = cursor.selectionStart();
        const int anchor = cursor.selectionEnd();
        const QTextBlock posBlock = d->doc->findBlock(position);
        const QTextBlock anchorBlock = d->doc->findBlock(anchor);
        if (posBlock == anchorBlock && posBlock.isValid() && posBlock.layout()->lineCount()) {
            const QTextLine posLine = posBlock.layout()->lineForTextPosition(position - posBlock.position());
            const QTextLine anchorLine = anchorBlock.layout()->lineForTextPosition(anchor - anchorBlock.position());

            const int firstLine = qMin(posLine.lineNumber(), anchorLine.lineNumber());
            const int lastLine = qMax(posLine.lineNumber(), anchorLine.lineNumber());
            const QTextLayout *layout = posBlock.layout();
            r = QRectF();
            for (int i = firstLine; i <= lastLine; ++i) {
                r |= layout->lineAt(i).rect();
                r |= layout->lineAt(i).naturalTextRect(); // might be bigger in the case of wrap not enabled
            }
            r.translate(blockBoundingRect(posBlock).topLeft());
        } else {
            QRectF anchorRect = d->rectForPosition(cursor.selectionEnd());
            r |= anchorRect;
            r |= boundingRectOfFloatsInSelection(cursor);
            QRectF frameRect(d->doc->documentLayout()->frameBoundingRect(cursor.currentFrame()));
            r.setLeft(frameRect.left());
            r.setRight(frameRect.right());
        }
        if (r.isValid())
            r.adjust(-1, -1, 1, 1);
    }

    return r;
}